

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall gimage::Histogram::visualize(Histogram *this,ImageU8 *image)

{
  ulong uVar1;
  long lVar2;
  ulong maxval;
  unsigned_long uVar3;
  
  if ((long)*(int *)(this + 4) < 1) {
    visualize(this,image,1);
    return;
  }
  maxval = 1;
  lVar2 = 0;
  do {
    if (0 < (int)*(uint *)this) {
      uVar1 = 0;
      uVar3 = maxval;
      do {
        maxval = *(ulong *)(*(long *)(*(long *)(this + 0x18) + lVar2 * 8) + uVar1 * 8);
        if (maxval < uVar3) {
          maxval = uVar3;
        }
        uVar1 = uVar1 + 1;
        uVar3 = maxval;
      } while (*(uint *)this != uVar1);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != *(int *)(this + 4));
  visualize(this,image,maxval);
  return;
}

Assistant:

void Histogram::visualize(ImageU8 &image) const
{
  unsigned long maxval=1;

  for (int k=0; k<h; k++)
  {
    for (int i=0; i<w; i++)
    {
      maxval=std::max(maxval, row[k][i]);
    }
  }

  visualize(image, maxval);
}